

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffiopn(fitsfile **fptr,char *name,int mode,int *status)

{
  int iVar1;
  int local_34;
  int *piStack_30;
  int hdutype;
  int *status_local;
  char *pcStack_20;
  int mode_local;
  char *name_local;
  fitsfile **fptr_local;
  
  if (*status < 1) {
    *status = -0x68;
    piStack_30 = status;
    status_local._4_4_ = mode;
    pcStack_20 = name;
    name_local = (char *)fptr;
    ffopen(fptr,name,mode,status);
    iVar1 = ffghdt(*(fitsfile **)name_local,&local_34,piStack_30);
    if ((iVar1 < 1) && (local_34 != 0)) {
      *piStack_30 = 0xe9;
    }
    fptr_local._4_4_ = *piStack_30;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffiopn(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - full name of file to open           */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file with either readonly or read/write access. and
  move to the first HDU that contains 'interesting' image (not an table). 
*/
{
    int hdutype;

    if (*status > 0)
        return(*status);

    *status = SKIP_TABLE;

    ffopen(fptr, name, mode, status);

    if (ffghdt(*fptr, &hdutype, status) <= 0) {
        if (hdutype != IMAGE_HDU)
            *status = NOT_IMAGE;
    }

    return(*status);
}